

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void ZopfliDeflatePart(ZopfliOptions *options,int btype,int final,uchar *in,size_t instart,
                      size_t inend,uchar *bp,uchar **out,size_t *outsize)

{
  unsigned_short *in_RCX;
  int in_ESI;
  size_t *in_RDI;
  size_t **in_R8;
  size_t *in_R9;
  double dVar1;
  size_t end_2;
  size_t start_2;
  size_t end_1;
  size_t start_1;
  double totalcost2;
  size_t npoints2;
  size_t *splitpoints2;
  ZopfliLZ77Store store_1;
  ZopfliBlockState s_1;
  size_t end;
  size_t start;
  ZopfliBlockState s;
  ZopfliLZ77Store store;
  ZopfliLZ77Store lz77;
  double totalcost;
  size_t *splitpoints;
  size_t npoints;
  size_t *splitpoints_uncompressed;
  size_t i;
  size_t in_stack_00000860;
  size_t in_stack_00000868;
  ZopfliLZ77Store *in_stack_00000870;
  int in_stack_00000878;
  int in_stack_0000087c;
  ZopfliOptions *in_stack_00000880;
  size_t in_stack_000008a0;
  uchar *in_stack_000008a8;
  uchar **in_stack_000008b0;
  size_t *in_stack_000008b8;
  ZopfliLZ77Store *in_stack_00003b00;
  int in_stack_00003b0c;
  size_t in_stack_00003b10;
  size_t in_stack_00003b18;
  uchar *in_stack_00003b20;
  ZopfliBlockState *in_stack_00003b28;
  ZopfliLZ77Store *in_stack_fffffffffffffde8;
  ZopfliLZ77Store *in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffdf8;
  ZopfliOptions *in_stack_fffffffffffffe00;
  size_t in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  ZopfliLZ77Store *in_stack_fffffffffffffe20;
  uchar *in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe38;
  size_t *in_stack_fffffffffffffe40;
  size_t **in_stack_fffffffffffffe48;
  ZopfliOptions *in_stack_fffffffffffffe50;
  ZopfliLZ77Store *in_stack_fffffffffffffe58;
  ZopfliOptions *in_stack_fffffffffffffe60;
  size_t *in_stack_fffffffffffffe68;
  double local_190;
  ZopfliLZ77Store *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffe98;
  uchar *in_stack_fffffffffffffea0;
  size_t *in_stack_fffffffffffffea8;
  ZopfliBlockState *in_stack_fffffffffffffeb0;
  unsigned_short *in_stack_fffffffffffffeb8;
  size_t *in_stack_fffffffffffffec0;
  ZopfliLZ77Store *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed4;
  ZopfliOptions *in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  size_t *in_stack_fffffffffffffef0;
  size_t **in_stack_fffffffffffffef8;
  ZopfliOptions *in_stack_ffffffffffffff00;
  size_t *in_stack_ffffffffffffff10;
  ZopfliLZ77Store local_e0;
  ZopfliLZ77Store local_98;
  double local_50;
  void *local_48;
  unsigned_short *local_40;
  unsigned_short *local_38;
  unsigned_short *local_30;
  size_t *local_28;
  size_t **local_20;
  unsigned_short *local_18;
  size_t *local_8;
  
  local_38 = (unsigned_short *)0x0;
  local_40 = (unsigned_short *)0x0;
  local_48 = (void *)0x0;
  local_50 = 0.0;
  if (in_ESI == 0) {
    AddNonCompressedBlock
              (in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
               (uchar *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
               (uchar **)in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
  }
  else if (in_ESI == 1) {
    ZopfliInitLZ77Store((uchar *)in_RCX,&local_e0);
    ZopfliInitBlockState
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(size_t)in_stack_fffffffffffffdf0
               ,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),(ZopfliBlockState *)0x103596);
    ZopfliLZ77OptimalFixed
              (in_stack_fffffffffffffeb0,(uchar *)in_stack_fffffffffffffea8,
               (size_t)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90
              );
    AddLZ77Block(in_stack_00000880,in_stack_0000087c,in_stack_00000878,in_stack_00000870,
                 in_stack_00000868,in_stack_00000860,in_stack_000008a0,in_stack_000008a8,
                 in_stack_000008b0,in_stack_000008b8);
    ZopfliCleanBlockState((ZopfliBlockState *)0x10362d);
    ZopfliCleanLZ77Store((ZopfliLZ77Store *)0x10363a);
  }
  else {
    local_28 = in_R9;
    local_20 = in_R8;
    local_18 = in_RCX;
    local_8 = in_RDI;
    if (*(int *)((long)in_RDI + 0xc) != 0) {
      in_stack_fffffffffffffde8 = (ZopfliLZ77Store *)&stack0xffffffffffffffc0;
      ZopfliBlockSplit(in_stack_ffffffffffffff00,(uchar *)in_stack_fffffffffffffef8,
                       (size_t)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                       in_stack_fffffffffffffee0,(size_t **)in_stack_fffffffffffffed8,
                       in_stack_ffffffffffffff10);
      local_48 = malloc((long)local_40 << 3);
    }
    ZopfliInitLZ77Store((uchar *)local_18,&local_98);
    for (local_30 = (unsigned_short *)0x0; local_30 <= local_40;
        local_30 = (unsigned_short *)((long)local_30 + 1)) {
      in_stack_fffffffffffffe48 = local_20;
      if (local_30 != (unsigned_short *)0x0) {
        in_stack_fffffffffffffe48 = *(size_t ***)(local_38 + ((long)local_30 - 1U) * 4);
      }
      in_stack_fffffffffffffe40 = local_28;
      if (local_30 != local_40) {
        in_stack_fffffffffffffe40 = *(size_t **)(local_38 + (long)local_30 * 4);
      }
      in_stack_fffffffffffffef0 = in_stack_fffffffffffffe40;
      in_stack_fffffffffffffef8 = in_stack_fffffffffffffe48;
      ZopfliInitLZ77Store((uchar *)local_18,(ZopfliLZ77Store *)&stack0xfffffffffffffe88);
      ZopfliInitBlockState
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 (size_t)in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                 (ZopfliBlockState *)0x1037ae);
      ZopfliLZ77Optimal(in_stack_00003b28,in_stack_00003b20,in_stack_00003b18,in_stack_00003b10,
                        in_stack_00003b0c,in_stack_00003b00);
      dVar1 = ZopfliCalculateBlockSizeAutoType
                        (in_stack_fffffffffffffe20,
                         CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                         in_stack_fffffffffffffe10);
      local_50 = dVar1 + local_50;
      ZopfliAppendLZ77Store(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      if (local_30 < local_40) {
        *(size_t *)((long)local_48 + (long)local_30 * 8) = local_98.size;
      }
      ZopfliCleanBlockState((ZopfliBlockState *)0x103862);
      ZopfliCleanLZ77Store((ZopfliLZ77Store *)0x10386f);
    }
    if ((*(int *)((long)local_8 + 0xc) != 0) && ((unsigned_short *)0x1 < local_40)) {
      local_190 = 0.0;
      ZopfliBlockSplitLZ77
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (size_t)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                 in_stack_fffffffffffffe40);
      for (local_30 = (unsigned_short *)0x0; local_30 == (unsigned_short *)0x0;
          local_30 = (unsigned_short *)((long)local_30 + 1)) {
        dVar1 = ZopfliCalculateBlockSizeAutoType
                          (in_stack_fffffffffffffe20,
                           CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
                           in_stack_fffffffffffffe10);
        local_190 = dVar1 + local_190;
      }
      if (local_50 <= local_190) {
        free((void *)0x0);
      }
      else {
        free(local_48);
        local_48 = (void *)0x0;
        local_40 = (unsigned_short *)0x0;
      }
    }
    for (local_30 = (unsigned_short *)0x0; local_30 <= local_40;
        local_30 = (unsigned_short *)((long)local_30 + 1)) {
      AddLZ77BlockAutoType
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8,
                 (size_t)in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                 (size_t)in_stack_fffffffffffffeb0,(uchar *)in_stack_fffffffffffffef0,
                 (uchar **)in_stack_fffffffffffffef8,(size_t *)in_stack_ffffffffffffff00);
    }
    ZopfliCleanLZ77Store((ZopfliLZ77Store *)0x103b86);
    free(local_48);
    free(local_38);
  }
  return;
}

Assistant:

void ZopfliDeflatePart(const ZopfliOptions* options, int btype, int final,
                       const unsigned char* in, size_t instart, size_t inend,
                       unsigned char* bp, unsigned char** out,
                       size_t* outsize) {
  size_t i;
  /* byte coordinates rather than lz77 index */
  size_t* splitpoints_uncompressed = 0;
  size_t npoints = 0;
  size_t* splitpoints = 0;
  double totalcost = 0;
  ZopfliLZ77Store lz77;

  /* If btype=2 is specified, it tries all block types. If a lesser btype is
  given, then however it forces that one. Neither of the lesser types needs
  block splitting as they have no dynamic huffman trees. */
  if (btype == 0) {
    AddNonCompressedBlock(options, final, in, instart, inend, bp, out, outsize);
    return;
  } else if (btype == 1) {
    ZopfliLZ77Store store;
    ZopfliBlockState s;
    ZopfliInitLZ77Store(in, &store);
    ZopfliInitBlockState(options, instart, inend, 1, &s);

    ZopfliLZ77OptimalFixed(&s, in, instart, inend, &store);
    AddLZ77Block(options, btype, final, &store, 0, store.size, 0,
                 bp, out, outsize);

    ZopfliCleanBlockState(&s);
    ZopfliCleanLZ77Store(&store);
    return;
  }


  if (options->blocksplitting) {
    ZopfliBlockSplit(options, in, instart, inend,
                     options->blocksplittingmax,
                     &splitpoints_uncompressed, &npoints);
    splitpoints = (size_t*)malloc(sizeof(*splitpoints) * npoints);
  }

  ZopfliInitLZ77Store(in, &lz77);

  for (i = 0; i <= npoints; i++) {
    size_t start = i == 0 ? instart : splitpoints_uncompressed[i - 1];
    size_t end = i == npoints ? inend : splitpoints_uncompressed[i];
    ZopfliBlockState s;
    ZopfliLZ77Store store;
    ZopfliInitLZ77Store(in, &store);
    ZopfliInitBlockState(options, start, end, 1, &s);
    ZopfliLZ77Optimal(&s, in, start, end, options->numiterations, &store);
    totalcost += ZopfliCalculateBlockSizeAutoType(&store, 0, store.size);

    ZopfliAppendLZ77Store(&store, &lz77);
    if (i < npoints) splitpoints[i] = lz77.size;

    ZopfliCleanBlockState(&s);
    ZopfliCleanLZ77Store(&store);
  }

  /* Second block splitting attempt */
  if (options->blocksplitting && npoints > 1) {
    size_t* splitpoints2 = 0;
    size_t npoints2 = 0;
    double totalcost2 = 0;

    ZopfliBlockSplitLZ77(options, &lz77,
                         options->blocksplittingmax, &splitpoints2, &npoints2);

    for (i = 0; i <= npoints2; i++) {
      size_t start = i == 0 ? 0 : splitpoints2[i - 1];
      size_t end = i == npoints2 ? lz77.size : splitpoints2[i];
      totalcost2 += ZopfliCalculateBlockSizeAutoType(&lz77, start, end);
    }

    if (totalcost2 < totalcost) {
      free(splitpoints);
      splitpoints = splitpoints2;
      npoints = npoints2;
    } else {
      free(splitpoints2);
    }
  }

  for (i = 0; i <= npoints; i++) {
    size_t start = i == 0 ? 0 : splitpoints[i - 1];
    size_t end = i == npoints ? lz77.size : splitpoints[i];
    AddLZ77BlockAutoType(options, i == npoints && final,
                         &lz77, start, end, 0,
                         bp, out, outsize);
  }

  ZopfliCleanLZ77Store(&lz77);
  free(splitpoints);
  free(splitpoints_uncompressed);
}